

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void LiteScript::StateExecutor::I_VALUE_ASSIGN(State *state,Instruction *instr)

{
  pointer pVVar1;
  Variable *this;
  Variable V;
  undefined1 auStack_38 [32];
  Variable local_18;
  
  state->line_num = state->line_num + 1;
  pVVar1 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar1 != (state->op_lifo).
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                _M_impl.super__Vector_impl_data._M_start) {
    Variable::Variable(&local_18,pVVar1 + -1);
    this = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
    (state->op_lifo).super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
    ._M_impl.super__Vector_impl_data._M_finish = this;
    Variable::~Variable(this);
    Memory::Create((Memory *)auStack_38,(Type *)state->memory);
    Variable::operator=((Variable *)(auStack_38 + 0x10),(Variable *)auStack_38);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&state->op_lifo,(Variable *)(auStack_38 + 0x10));
    Variable::~Variable((Variable *)(auStack_38 + 0x10));
    Variable::~Variable((Variable *)auStack_38);
    Variable::~Variable(&local_18);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_ASSIGN(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() == 0)
        return;
    Variable V = state.op_lifo.back();
    state.op_lifo.pop_back();
    state.op_lifo.push_back(state.memory.Create(Type::NIL) = V);
}